

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::tree_verifier(tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                *this,bool parallel_test_)

{
  byte in_SIL;
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *in_RDI;
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  inode_type_counter_array local_90;
  inode_type_counter_array local_70;
  byte local_39;
  
  local_39 = in_SIL & 1;
  in_RDI->unused_key = 0;
  auVar1 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])&(in_RDI->test_db).mutex.super___mutex_base._M_mutex = ZEXT1632(auVar1);
  *(undefined1 (*) [32])((in_RDI->test_db).db_.shrinking_inode_counts._M_elems + 1) =
       ZEXT1632(auVar1);
  auVar2 = ZEXT1632(auVar1);
  *(undefined1 (*) [32])((in_RDI->test_db).db_.growing_inode_counts._M_elems + 1) = auVar2;
  *(undefined1 (*) [32])((in_RDI->test_db).db_.node_counts._M_elems + 2) = auVar2;
  (in_RDI->test_db).db_.root = (node_ptr)auVar2._0_8_;
  (in_RDI->test_db).db_.current_memory_use = auVar2._8_8_;
  (in_RDI->test_db).db_.node_counts._M_elems[0] = auVar2._16_8_;
  (in_RDI->test_db).db_.node_counts._M_elems[1] = auVar2._24_8_;
  (in_RDI->test_db).mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::mutex_db
            (&in_RDI->test_db);
  std::
  map<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::map(&in_RDI->values);
  in_RDI->parallel_test = (bool)(local_39 & 1);
  (in_RDI->key_views).
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->key_views).
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->key_views).
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>::vector
            (&in_RDI->key_views);
  assert_empty(in_RDI);
  local_70._M_elems = (_Type)ZEXT1632(ZEXT816(0) << 0x40);
  assert_growing_inodes(in_RDI,&local_70);
  local_90._M_elems[0] = 0;
  local_90._M_elems[1] = 0;
  local_90._M_elems[2] = 0;
  local_90._M_elems[3] = 0;
  assert_shrinking_inodes(in_RDI,&local_90);
  assert_key_prefix_splits(in_RDI,0);
  return;
}

Assistant:

explicit tree_verifier(bool parallel_test_ = false)
      : parallel_test{parallel_test_} {
    assert_empty();
#ifdef UNODB_DETAIL_WITH_STATS
    assert_growing_inodes({0, 0, 0, 0});
    assert_shrinking_inodes({0, 0, 0, 0});
    assert_key_prefix_splits(0);
#endif  // UNODB_DETAIL_WITH_STATS
  }